

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MunitionReload.cpp
# Opt level: O0

int __thiscall DIS::MunitionReload::getMarshalledSize(MunitionReload *this)

{
  int iVar1;
  int marshalSize;
  MunitionReload *this_local;
  
  iVar1 = EntityType::getMarshalledSize(&this->_munitionType);
  return iVar1 + 0xc;
}

Assistant:

int MunitionReload::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = marshalSize + _munitionType.getMarshalledSize();  // _munitionType
   marshalSize = marshalSize + 4;  // _station
   marshalSize = marshalSize + 2;  // _standardQuantity
   marshalSize = marshalSize + 2;  // _maximumQuantity
   marshalSize = marshalSize + 2;  // _stationName
   marshalSize = marshalSize + 2;  // _stationNumber
    return marshalSize;
}